

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_intersect(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  int iVar2;
  int threshold;
  int32_t card_2;
  int32_t card_1;
  array_container_t *array2_local;
  array_container_t *array1_local;
  
  iVar1 = array1->cardinality;
  iVar2 = array2->cardinality;
  if (iVar1 * 0x40 < iVar2) {
    array1_local._7_1_ =
         intersect_skewed_uint16_nonempty(array1->array,(long)iVar1,array2->array,(long)iVar2);
  }
  else if (iVar2 * 0x40 < iVar1) {
    array1_local._7_1_ =
         intersect_skewed_uint16_nonempty(array2->array,(long)iVar2,array1->array,(long)iVar1);
  }
  else {
    array1_local._7_1_ =
         intersect_uint16_nonempty(array1->array,(long)iVar1,array2->array,(long)iVar2);
  }
  return array1_local._7_1_;
}

Assistant:

bool array_container_intersect(const array_container_t *array1,
                                  const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_nonempty(
            array1->array, card_1, array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
    	return intersect_skewed_uint16_nonempty(
            array2->array, card_2, array1->array, card_1);
    } else {
    	// we do not bother vectorizing
        return intersect_uint16_nonempty(array1->array, card_1,
                                            array2->array, card_2);
    }
}